

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O1

void print_pcs_file(char *output_file_name)

{
  FILE *__s;
  
  if (output_file_name == (char *)0x0) {
    return;
  }
  __s = fopen(output_file_name,"wb");
  fwrite("# PCS Information for MergeSat\n#\n#\n# Parameters\n#\n#\n",0x34,1,__s);
  Minisat::printOptions(__s,0);
  fwrite("\n\n#\n#\n# Dependencies \n#\n#\n",0x1a,1,__s);
  Minisat::printOptionsDependencies(__s,0);
  fclose(__s);
  exit(0);
}

Assistant:

void print_pcs_file(const char *output_file_name)
{
    if (0 != (const char *)output_file_name) {
        FILE *pcsFile = fopen((const char *)output_file_name, "wb"); // open file
        fprintf(pcsFile, "# PCS Information for MergeSat\n#\n#\n# Parameters\n#\n#\n");
        ::printOptions(pcsFile);
        fprintf(pcsFile, "\n\n#\n#\n# Dependencies \n#\n#\n");
        ::printOptionsDependencies(pcsFile);
        fclose(pcsFile);
        exit(0);
    }
}